

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Tbc::Text::Text(Text *this,string *_str,TextAttributes *_attr)

{
  size_t sVar1;
  size_t sVar2;
  char cVar3;
  undefined7 uVar4;
  ulong uVar5;
  byte bVar6;
  size_type sVar7;
  unsigned_long *puVar8;
  char *pcVar9;
  ulong uVar10;
  long lVar11;
  reference this_00;
  size_t local_198;
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0 [32];
  ulong local_d0;
  size_t pos;
  unsigned_long local_c0;
  ulong local_b8;
  size_t width;
  size_t tabPos;
  string local_a0 [32];
  string local_80 [8];
  string remainder;
  size_t local_60;
  size_t indent;
  allocator local_41;
  string local_40 [8];
  string wrappableChars;
  TextAttributes *_attr_local;
  string *_str_local;
  Text *this_local;
  
  std::__cxx11::string::string((string *)this);
  sVar1 = _attr->initialIndent;
  sVar2 = _attr->indent;
  cVar3 = _attr->tabChar;
  uVar4 = *(undefined7 *)&_attr->field_0x19;
  (this->attr).width = _attr->width;
  (this->attr).tabChar = cVar3;
  *(undefined7 *)&(this->attr).field_0x19 = uVar4;
  (this->attr).initialIndent = sVar1;
  (this->attr).indent = sVar2;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->lines);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40," [({.,/|\\-",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  if (_attr->initialIndent == 0xffffffffffffffff) {
    local_198 = _attr->indent;
  }
  else {
    local_198 = _attr->initialIndent;
  }
  local_60 = local_198;
  std::__cxx11::string::string(local_80,(string *)_str);
  do {
    bVar6 = std::__cxx11::string::empty();
    if (((bVar6 ^ 0xff) & 1) == 0) {
      tabPos._0_4_ = 0;
LAB_001a24cd:
      std::__cxx11::string::~string(local_80);
      std::__cxx11::string::~string(local_40);
      return;
    }
    sVar7 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->lines);
    if (999 < sVar7) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_a0,"... message truncated due to excessive size",
                 (allocator *)((long)&tabPos + 7));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->lines,(value_type *)local_a0);
      std::__cxx11::string::~string(local_a0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&tabPos + 7));
      tabPos._0_4_ = 1;
      goto LAB_001a24cd;
    }
    width = 0xffffffffffffffff;
    local_c0 = std::__cxx11::string::size();
    pos = _attr->width - local_60;
    puVar8 = std::min<unsigned_long>(&local_c0,&pos);
    local_b8 = *puVar8;
    local_d0 = std::__cxx11::string::find_first_of((char)local_80,10);
    if (local_d0 <= local_b8) {
      local_b8 = local_d0;
    }
    local_d0 = std::__cxx11::string::find_last_of((char)local_80,(ulong)(uint)(int)_attr->tabChar);
    if (local_d0 != 0xffffffffffffffff) {
      width = local_d0;
      pcVar9 = (char *)std::__cxx11::string::operator[]((ulong)local_80);
      if (*pcVar9 == '\n') {
        local_b8 = local_b8 - 1;
      }
      std::__cxx11::string::substr((ulong)local_110,(ulong)local_80);
      std::__cxx11::string::substr((ulong)local_130,(ulong)local_80);
      std::operator+(local_f0,local_110);
      std::__cxx11::string::operator=(local_80,(string *)local_f0);
      std::__cxx11::string::~string((string *)local_f0);
      std::__cxx11::string::~string(local_130);
      std::__cxx11::string::~string((string *)local_110);
    }
    uVar5 = local_b8;
    uVar10 = std::__cxx11::string::size();
    if (uVar5 == uVar10) {
      spliceLine(this,local_60,(string *)local_80,local_b8);
    }
    else {
      pcVar9 = (char *)std::__cxx11::string::operator[]((ulong)local_80);
      if (*pcVar9 == '\n') {
        spliceLine(this,local_60,(string *)local_80,local_b8);
        if ((local_b8 < 2) || (lVar11 = std::__cxx11::string::size(), lVar11 != 1)) {
          std::__cxx11::string::substr((ulong)local_150,(ulong)local_80);
          std::__cxx11::string::operator=(local_80,local_150);
          std::__cxx11::string::~string(local_150);
        }
        local_60 = _attr->indent;
      }
      else {
        local_d0 = std::__cxx11::string::find_last_of(local_80,(ulong)local_40);
        if ((local_d0 == 0xffffffffffffffff) || (local_d0 == 0)) {
          spliceLine(this,local_60,(string *)local_80,local_b8 - 1);
          this_00 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::back(&this->lines);
          std::__cxx11::string::operator+=((string *)this_00,"-");
        }
        else {
          spliceLine(this,local_60,(string *)local_80,local_d0);
          pcVar9 = (char *)std::__cxx11::string::operator[]((ulong)local_80);
          if (*pcVar9 == ' ') {
            std::__cxx11::string::substr((ulong)local_170,(ulong)local_80);
            std::__cxx11::string::operator=(local_80,local_170);
            std::__cxx11::string::~string(local_170);
          }
        }
        sVar7 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&this->lines);
        if (sVar7 == 1) {
          local_60 = _attr->indent;
        }
        if (width != 0xffffffffffffffff) {
          local_60 = width + local_60;
        }
      }
    }
  } while( true );
}

Assistant:

Text( std::string const& _str, TextAttributes const& _attr = TextAttributes() )
        : attr( _attr )
        {
            std::string wrappableChars = " [({.,/|\\-";
            std::size_t indent = _attr.initialIndent != std::string::npos
                ? _attr.initialIndent
                : _attr.indent;
            std::string remainder = _str;

            while( !remainder.empty() ) {
                if( lines.size() >= 1000 ) {
                    lines.push_back( "... message truncated due to excessive size" );
                    return;
                }
                std::size_t tabPos = std::string::npos;
                std::size_t width = (std::min)( remainder.size(), _attr.width - indent );
                std::size_t pos = remainder.find_first_of( '\n' );
                if( pos <= width ) {
                    width = pos;
                }
                pos = remainder.find_last_of( _attr.tabChar, width );
                if( pos != std::string::npos ) {
                    tabPos = pos;
                    if( remainder[width] == '\n' )
                        width--;
                    remainder = remainder.substr( 0, tabPos ) + remainder.substr( tabPos+1 );
                }

                if( width == remainder.size() ) {
                    spliceLine( indent, remainder, width );
                }
                else if( remainder[width] == '\n' ) {
                    spliceLine( indent, remainder, width );
                    if( width <= 1 || remainder.size() != 1 )
                        remainder = remainder.substr( 1 );
                    indent = _attr.indent;
                }
                else {
                    pos = remainder.find_last_of( wrappableChars, width );
                    if( pos != std::string::npos && pos > 0 ) {
                        spliceLine( indent, remainder, pos );
                        if( remainder[0] == ' ' )
                            remainder = remainder.substr( 1 );
                    }
                    else {
                        spliceLine( indent, remainder, width-1 );
                        lines.back() += "-";
                    }
                    if( lines.size() == 1 )
                        indent = _attr.indent;
                    if( tabPos != std::string::npos )
                        indent += tabPos;
                }
            }
        }